

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          CappedArray<char,_14UL> *params_6,ArrayPtr<const_char> *params_7,StringTree *params_8,
          ArrayPtr<const_char> *params_9,String *params_10,ArrayPtr<const_char> *params_11,
          ArrayPtr<const_char> *params_12,ArrayPtr<const_char> *params_13,
          CappedArray<char,_14UL> *params_14,ArrayPtr<const_char> *params_15)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  long lVar4;
  Branch *pBVar5;
  char *pos;
  long lVar6;
  long lVar7;
  size_t elementCount;
  size_t local_f0;
  char *pcStack_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined8 local_b8;
  char *local_b0;
  char *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  String local_70;
  StringTree *local_58;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  lVar4 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  lVar6 = 0;
  lVar7 = 0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_f0 = this->size_;
  pcStack_e8 = (params->text).content.ptr;
  local_e0 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_e0 = lVar4;
  }
  local_d8._0_8_ = (params_2->content).size_;
  local_d8._8_8_ = params_3->size_;
  local_c8._0_8_ = params_4->size_;
  local_c8._8_8_ = params_5->ptr;
  local_b8 = *(undefined8 *)params_6->content;
  local_b0 = params_7->ptr;
  local_a8 = (params_8->text).content.ptr;
  local_a0 = params_9->size_ - 1;
  if (params_9->size_ == 0) {
    local_a0 = lVar4;
  }
  local_98._0_8_ = (params_10->content).size_;
  local_98._8_8_ = params_11->size_;
  local_88._0_8_ = params_12->size_;
  local_88._8_8_ = params_13->ptr;
  local_78 = *(undefined8 *)params_14->content;
  do {
    lVar6 = lVar6 + (&local_f0)[lVar4];
    lVar7 = lVar7 + (&local_f0)[lVar4 + 1];
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x10);
  __return_storage_ptr__->size_ = lVar7 + lVar6;
  lVar4 = 0;
  local_f0 = 0;
  local_e0 = 0;
  local_b0 = (char *)0x0;
  local_a0 = 0;
  lVar6 = 0;
  lVar7 = 0;
  do {
    lVar6 = lVar6 + (&local_f0)[lVar4];
    lVar7 = lVar7 + (&local_f0)[lVar4 + 1];
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x10);
  local_58 = this;
  local_50 = params;
  local_48 = params_1;
  local_40 = params_3;
  local_38 = (ArrayPtr<const_char> *)params_2;
  heapString(&local_70,lVar7 + lVar6);
  (__return_storage_ptr__->text).content.ptr = local_70.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_70.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_70.content.disposer;
  local_f0 = 1;
  lVar4 = 0;
  pcStack_e8 = (char *)0x0;
  local_e0 = 1;
  lVar6 = 0;
  lVar7 = 0;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_b8 = 0;
  local_b0 = (char *)0x1;
  local_a8 = (char *)0x0;
  local_a0 = 1;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = 0;
  do {
    lVar6 = lVar6 + (&local_f0)[lVar4];
    lVar7 = lVar7 + (&local_f0)[lVar4 + 1];
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x10);
  elementCount = lVar7 + lVar6;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,elementCount,elementCount,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_70.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_70.content.ptr = (char *)pBVar5;
  local_70.content.size_ = elementCount;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = elementCount;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_58,(ArrayPtr<const_char> *)local_50,
             (String *)local_48,local_38,local_40,params_4,(CappedArray<char,_14UL> *)params_5,
             (ArrayPtr<const_char> *)params_6,(StringTree *)params_7,
             (ArrayPtr<const_char> *)params_8,(String *)params_9,(ArrayPtr<const_char> *)params_10,
             params_11,params_12,(CappedArray<char,_14UL> *)params_13,
             (ArrayPtr<const_char> *)params_14);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}